

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_set_header_ext(nni_list *l,char *n,char *v,_Bool strip_dups)

{
  int iVar1;
  char *s;
  void *item;
  char *pcVar2;
  char *nv;
  ws_header *hdr;
  _Bool strip_dups_local;
  char *v_local;
  char *n_local;
  nni_list *l_local;
  
  s = nni_strdup(v);
  if (s == (char *)0x0) {
    l_local._4_4_ = 2;
  }
  else {
    if (strip_dups) {
      for (nv = (char *)nni_list_first(l); nv != (char *)0x0; nv = (char *)nni_list_next(l,nv)) {
        iVar1 = nni_strcasecmp(*(char **)(nv + 0x10),n);
        if (iVar1 == 0) {
          nni_strfree(*(char **)(nv + 0x18));
          *(char **)(nv + 0x18) = s;
          return 0;
        }
      }
    }
    item = nni_zalloc(0x20);
    if (item == (void *)0x0) {
      nni_strfree(s);
      l_local._4_4_ = 2;
    }
    else {
      pcVar2 = nni_strdup(n);
      *(char **)((long)item + 0x10) = pcVar2;
      if (pcVar2 == (char *)0x0) {
        nni_strfree(s);
        nni_free(item,0x20);
        l_local._4_4_ = 2;
      }
      else {
        *(char **)((long)item + 0x18) = s;
        nni_list_append(l,item);
        l_local._4_4_ = 0;
      }
    }
  }
  return l_local._4_4_;
}

Assistant:

static int
ws_set_header_ext(nni_list *l, const char *n, const char *v, bool strip_dups)
{
	ws_header *hdr;
	char      *nv;

	if ((nv = nni_strdup(v)) == NULL) {
		return (NNG_ENOMEM);
	}

	if (strip_dups) {
		NNI_LIST_FOREACH (l, hdr) {
			if (nni_strcasecmp(hdr->name, n) == 0) {
				nni_strfree(hdr->value);
				hdr->value = nv;
				return (0);
			}
		}
	}

	if ((hdr = NNI_ALLOC_STRUCT(hdr)) == NULL) {
		nni_strfree(nv);
		return (NNG_ENOMEM);
	}
	if ((hdr->name = nni_strdup(n)) == NULL) {
		nni_strfree(nv);
		NNI_FREE_STRUCT(hdr);
		return (NNG_ENOMEM);
	}
	hdr->value = nv;
	nni_list_append(l, hdr);
	return (0);
}